

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjpeg.c
# Opt level: O0

int parse_switches(j_compress_ptr cinfo,int argc,char **argv,int last_file_arg_seen,boolean for_real
                  )

{
  int iVar1;
  boolean bVar2;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  int in_R8D;
  int val;
  char ch_1;
  long lval_1;
  char ch;
  long lval;
  char *scansarg;
  char *samplearg;
  char *qslotsarg;
  char *qtablefile;
  char *qualityarg;
  boolean simple_progressive;
  boolean force_baseline;
  char *arg;
  int argn;
  boolean in_stack_0000009c;
  char *in_stack_000000a0;
  j_compress_ptr in_stack_000000a8;
  char *in_stack_00000db0;
  j_compress_ptr in_stack_00000db8;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  char cVar3;
  j_compress_ptr in_stack_ffffffffffffff88;
  char local_69;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  int local_38;
  undefined4 local_34;
  char *local_30;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  int local_c;
  long *local_8;
  
  local_40 = 0;
  local_48 = 0;
  local_50 = 0;
  local_58 = 0;
  local_60 = 0;
  local_34 = 0;
  local_38 = 0;
  is_targa = 0;
  icc_filename = (char *)0x0;
  outfilename = (char *)0x0;
  memdst = 0;
  report = 0;
  *(undefined4 *)(*in_RDI + 0x7c) = 0;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_24 = 1; local_24 < local_c; local_24 = local_24 + 1) {
    local_30 = *(char **)(local_18 + (long)local_24 * 8);
    if (*local_30 == '-') {
      local_30 = local_30 + 1;
      bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                       (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff7c);
      if (bVar2 == 0) {
        bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                         (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff7c);
        if (bVar2 == 0) {
          bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                           (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           in_stack_ffffffffffffff7c);
          if (bVar2 == 0) {
            bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                             (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff7c);
            if ((bVar2 == 0) &&
               (bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                                 (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80),
                                 in_stack_ffffffffffffff7c), bVar2 == 0)) {
              bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                               (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                               ,in_stack_ffffffffffffff7c);
              if (bVar2 != 0) {
                fprintf(_stderr,"%s version %s (build %s)\n","libjpeg-turbo","2.1.1","20250502");
                exit(0);
              }
              bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                               (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                               ,in_stack_ffffffffffffff7c);
              if ((bVar2 == 0) &&
                 (bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                                   (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                    in_stack_ffffffffffffff80),
                                   in_stack_ffffffffffffff7c), bVar2 == 0)) {
                bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                                 (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80),
                                 in_stack_ffffffffffffff7c);
                if (bVar2 == 0) {
                  bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                                   (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                    in_stack_ffffffffffffff80),
                                   in_stack_ffffffffffffff7c);
                  if (bVar2 == 0) {
                    bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                                     (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                      in_stack_ffffffffffffff80),
                                     in_stack_ffffffffffffff7c);
                    if (bVar2 == 0) {
                      bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                                       (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                        in_stack_ffffffffffffff80),
                                       in_stack_ffffffffffffff7c);
                      if ((bVar2 == 0) &&
                         (bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                                           (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                            in_stack_ffffffffffffff80),
                                           in_stack_ffffffffffffff7c), bVar2 == 0)) {
                        bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                                         (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                          in_stack_ffffffffffffff80),
                                         in_stack_ffffffffffffff7c);
                        if (bVar2 == 0) {
                          bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                                           (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                            in_stack_ffffffffffffff80),
                                           in_stack_ffffffffffffff7c);
                          if (bVar2 == 0) {
                            bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                                             (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                              in_stack_ffffffffffffff80),
                                             in_stack_ffffffffffffff7c);
                            if (bVar2 == 0) {
                              bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                                               (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                                in_stack_ffffffffffffff80),
                                               in_stack_ffffffffffffff7c);
                              if (bVar2 == 0) {
                                bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                                                 (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                                  in_stack_ffffffffffffff80),
                                                 in_stack_ffffffffffffff7c);
                                if (bVar2 == 0) {
                                  bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                                                   (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                                    in_stack_ffffffffffffff80),
                                                   in_stack_ffffffffffffff7c);
                                  if (bVar2 == 0) {
                                    bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                                                     (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                                      in_stack_ffffffffffffff80),
                                                     in_stack_ffffffffffffff7c);
                                    if (bVar2 == 0) {
                                      bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                                                       (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                                        in_stack_ffffffffffffff80),
                                                       in_stack_ffffffffffffff7c);
                                      if (bVar2 == 0) {
                                        bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                                                         (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                                          in_stack_ffffffffffffff80)
                                                         ,in_stack_ffffffffffffff7c);
                                        if (bVar2 == 0) {
                                          bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                                                           (char *)CONCAT44(
                                                  in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80),
                                                  in_stack_ffffffffffffff7c);
                                          if (bVar2 == 0) {
                                            bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                                                             (char *)CONCAT44(
                                                  in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80),
                                                  in_stack_ffffffffffffff7c);
                                            if (bVar2 == 0) {
                                              bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                                                               (char *)CONCAT44(
                                                  in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80),
                                                  in_stack_ffffffffffffff7c);
                                              if (bVar2 == 0) {
                                                usage();
                                              }
                                              else {
                                                is_targa = 1;
                                              }
                                            }
                                            else {
                                              local_24 = local_24 + 1;
                                              if (local_c <= local_24) {
                                                usage();
                                              }
                                              iVar1 = __isoc99_sscanf(*(undefined8 *)
                                                                       (local_18 +
                                                                       (long)local_24 * 8),"%d",
                                                                      &stack0xffffffffffffff80);
                                              if (iVar1 != 1) {
                                                usage();
                                              }
                                              if ((in_stack_ffffffffffffff80 < 0) ||
                                                 (100 < in_stack_ffffffffffffff80)) {
                                                usage();
                                              }
                                              *(int *)(local_8 + 0x22) = in_stack_ffffffffffffff80;
                                            }
                                          }
                                          else {
                                            local_24 = local_24 + 1;
                                            if (local_c <= local_24) {
                                              usage();
                                            }
                                            local_60 = *(long *)(local_18 + (long)local_24 * 8);
                                          }
                                        }
                                        else {
                                          local_24 = local_24 + 1;
                                          if (local_c <= local_24) {
                                            usage();
                                          }
                                          local_58 = *(long *)(local_18 + (long)local_24 * 8);
                                        }
                                      }
                                      else {
                                        in_stack_ffffffffffffff84 =
                                             CONCAT13(0x78,(int3)in_stack_ffffffffffffff84);
                                        local_24 = local_24 + 1;
                                        if (local_c <= local_24) {
                                          usage();
                                        }
                                        iVar1 = __isoc99_sscanf(*(undefined8 *)
                                                                 (local_18 + (long)local_24 * 8),
                                                                "%ld%c",&stack0xffffffffffffff88,
                                                                &stack0xffffffffffffff87);
                                        if (iVar1 < 1) {
                                          usage();
                                        }
                                        if (((long)in_stack_ffffffffffffff88 < 0) ||
                                           (0xffff < (long)in_stack_ffffffffffffff88)) {
                                          usage();
                                        }
                                        cVar3 = (char)((uint)in_stack_ffffffffffffff84 >> 0x18);
                                        if ((cVar3 == 'b') || (cVar3 == 'B')) {
                                          *(int *)(local_8 + 0x23) = (int)in_stack_ffffffffffffff88;
                                          *(undefined4 *)((long)local_8 + 0x11c) = 0;
                                        }
                                        else {
                                          *(int *)((long)local_8 + 0x11c) =
                                               (int)in_stack_ffffffffffffff88;
                                        }
                                      }
                                    }
                                    else {
                                      report = 1;
                                    }
                                  }
                                  else {
                                    local_24 = local_24 + 1;
                                    if (local_c <= local_24) {
                                      usage();
                                    }
                                    local_48 = *(long *)(local_18 + (long)local_24 * 8);
                                  }
                                }
                                else {
                                  local_24 = local_24 + 1;
                                  if (local_c <= local_24) {
                                    usage();
                                  }
                                  local_50 = *(long *)(local_18 + (long)local_24 * 8);
                                }
                              }
                              else {
                                local_24 = local_24 + 1;
                                if (local_c <= local_24) {
                                  usage();
                                }
                                local_40 = *(long *)(local_18 + (long)local_24 * 8);
                              }
                            }
                            else {
                              memdst = 1;
                            }
                          }
                          else {
                            local_38 = 1;
                          }
                        }
                        else {
                          local_24 = local_24 + 1;
                          if (local_c <= local_24) {
                            usage();
                          }
                          outfilename = *(char **)(local_18 + (long)local_24 * 8);
                        }
                      }
                      else {
                        *(undefined4 *)(local_8 + 0x21) = 1;
                      }
                    }
                    else {
                      local_69 = 'x';
                      local_24 = local_24 + 1;
                      if (local_c <= local_24) {
                        usage();
                      }
                      iVar1 = __isoc99_sscanf(*(undefined8 *)(local_18 + (long)local_24 * 8),"%ld%c"
                                              ,&local_68,&local_69);
                      if (iVar1 < 1) {
                        usage();
                      }
                      if ((local_69 == 'm') || (local_69 == 'M')) {
                        local_68 = local_68 * 1000;
                      }
                      *(long *)(local_8[1] + 0x58) = local_68 * 1000;
                    }
                  }
                  else {
                    local_24 = local_24 + 1;
                    if (local_c <= local_24) {
                      usage();
                    }
                    icc_filename = *(char **)(local_18 + (long)local_24 * 8);
                  }
                }
                else {
                  jpeg_set_colorspace(local_8,2);
                }
              }
              else {
                jpeg_set_colorspace(local_8,1);
              }
            }
            else {
              if (parse_switches::printed_version == 0) {
                fprintf(_stderr,"%s version %s (build %s)\n","libjpeg-turbo","2.1.1","20250502");
                fprintf(_stderr,"%s\n\n",
                        "Copyright (C) 2009-2021 D. R. Commander\nCopyright (C) 2015, 2020 Google, Inc.\nCopyright (C) 2019-2020 Arm Limited\nCopyright (C) 2015-2016, 2018 Matthieu Darbois\nCopyright (C) 2011-2016 Siarhei Siamashka\nCopyright (C) 2015 Intel Corporation\nCopyright (C) 2013-2014 Linaro Limited\nCopyright (C) 2013-2014 MIPS Technologies, Inc.\nCopyright (C) 2009, 2012 Pierre Ossman for Cendio AB\nCopyright (C) 2009-2011 Nokia Corporation and/or its subsidiary(-ies)\nCopyright (C) 1999-2006 MIYASAKA Masaru\nCopyright (C) 1991-2020 Thomas G. Lane, Guido Vollbeding"
                       );
                fprintf(_stderr,"Emulating The Independent JPEG Group\'s software, version %s\n\n",
                        "6b  27-Mar-1998");
                parse_switches::printed_version = 1;
              }
              *(int *)(*local_8 + 0x7c) = *(int *)(*local_8 + 0x7c) + 1;
            }
          }
          else {
            local_24 = local_24 + 1;
            if (local_c <= local_24) {
              usage();
            }
            bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                             (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff7c);
            if (bVar2 == 0) {
              bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                               (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                               ,in_stack_ffffffffffffff7c);
              if (bVar2 == 0) {
                bVar2 = keymatch((char *)in_stack_ffffffffffffff88,
                                 (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80),
                                 in_stack_ffffffffffffff7c);
                if (bVar2 == 0) {
                  usage();
                }
                else {
                  *(undefined4 *)((long)local_8 + 0x114) = 2;
                }
              }
              else {
                *(undefined4 *)((long)local_8 + 0x114) = 1;
              }
            }
            else {
              *(undefined4 *)((long)local_8 + 0x114) = 0;
            }
          }
        }
        else {
          local_34 = 1;
        }
      }
      else {
        *(undefined4 *)((long)local_8 + 0x104) = 1;
      }
    }
    else {
      if (local_1c < local_24) break;
      outfilename = (char *)0x0;
    }
  }
  if (local_20 != 0) {
    if ((local_40 != 0) &&
       (bVar2 = set_quality_ratings(in_stack_ffffffffffffff88,
                                    (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                     in_stack_ffffffffffffff80),
                                    in_stack_ffffffffffffff7c), bVar2 == 0)) {
      usage();
    }
    if ((local_48 != 0) &&
       (bVar2 = read_quant_tables(in_stack_000000a8,in_stack_000000a0,in_stack_0000009c), bVar2 == 0
       )) {
      usage();
    }
    if ((local_50 != 0) &&
       (bVar2 = set_quant_slots(in_stack_ffffffffffffff88,
                                (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80
                                                )), bVar2 == 0)) {
      usage();
    }
    if ((local_58 != 0) &&
       (bVar2 = set_sample_factors(in_stack_ffffffffffffff88,
                                   (char *)CONCAT44(in_stack_ffffffffffffff84,
                                                    in_stack_ffffffffffffff80)), bVar2 == 0)) {
      usage();
    }
    if (local_38 != 0) {
      jpeg_simple_progression(local_8);
    }
    if ((local_60 != 0) &&
       (bVar2 = read_scan_script(in_stack_00000db8,in_stack_00000db0), bVar2 == 0)) {
      usage();
    }
  }
  return local_24;
}

Assistant:

LOCAL(int)
parse_switches(j_compress_ptr cinfo, int argc, char **argv,
               int last_file_arg_seen, boolean for_real)
/* Parse optional switches.
 * Returns argv[] index of first file-name argument (== argc if none).
 * Any file names with indexes <= last_file_arg_seen are ignored;
 * they have presumably been processed in a previous iteration.
 * (Pass 0 for last_file_arg_seen on the first or only iteration.)
 * for_real is FALSE on the first (dummy) pass; we may skip any expensive
 * processing.
 */
{
  int argn;
  char *arg;
  boolean force_baseline;
  boolean simple_progressive;
  char *qualityarg = NULL;      /* saves -quality parm if any */
  char *qtablefile = NULL;      /* saves -qtables filename if any */
  char *qslotsarg = NULL;       /* saves -qslots parm if any */
  char *samplearg = NULL;       /* saves -sample parm if any */
  char *scansarg = NULL;        /* saves -scans parm if any */

  /* Set up default JPEG parameters. */

  force_baseline = FALSE;       /* by default, allow 16-bit quantizers */
  simple_progressive = FALSE;
  is_targa = FALSE;
  icc_filename = NULL;
  outfilename = NULL;
  memdst = FALSE;
  report = FALSE;
  cinfo->err->trace_level = 0;

  /* Scan command line options, adjust parameters */

  for (argn = 1; argn < argc; argn++) {
    arg = argv[argn];
    if (*arg != '-') {
      /* Not a switch, must be a file name argument */
      if (argn <= last_file_arg_seen) {
        outfilename = NULL;     /* -outfile applies to just one input file */
        continue;               /* ignore this name if previously processed */
      }
      break;                    /* else done parsing switches */
    }
    arg++;                      /* advance past switch marker character */

    if (keymatch(arg, "arithmetic", 1)) {
      /* Use arithmetic coding. */
#ifdef C_ARITH_CODING_SUPPORTED
      cinfo->arith_code = TRUE;
#else
      fprintf(stderr, "%s: sorry, arithmetic coding not supported\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "baseline", 1)) {
      /* Force baseline-compatible output (8-bit quantizer values). */
      force_baseline = TRUE;

    } else if (keymatch(arg, "dct", 2)) {
      /* Select DCT algorithm. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "int", 1)) {
        cinfo->dct_method = JDCT_ISLOW;
      } else if (keymatch(argv[argn], "fast", 2)) {
        cinfo->dct_method = JDCT_IFAST;
      } else if (keymatch(argv[argn], "float", 2)) {
        cinfo->dct_method = JDCT_FLOAT;
      } else
        usage();

    } else if (keymatch(arg, "debug", 1) || keymatch(arg, "verbose", 1)) {
      /* Enable debug printouts. */
      /* On first -d, print version identification */
      static boolean printed_version = FALSE;

      if (!printed_version) {
        fprintf(stderr, "%s version %s (build %s)\n",
                PACKAGE_NAME, VERSION, BUILD);
        fprintf(stderr, "%s\n\n", JCOPYRIGHT);
        fprintf(stderr, "Emulating The Independent JPEG Group's software, version %s\n\n",
                JVERSION);
        printed_version = TRUE;
      }
      cinfo->err->trace_level++;

    } else if (keymatch(arg, "version", 4)) {
      fprintf(stderr, "%s version %s (build %s)\n",
              PACKAGE_NAME, VERSION, BUILD);
      exit(EXIT_SUCCESS);

    } else if (keymatch(arg, "grayscale", 2) ||
               keymatch(arg, "greyscale", 2)) {
      /* Force a monochrome JPEG file to be generated. */
      jpeg_set_colorspace(cinfo, JCS_GRAYSCALE);

    } else if (keymatch(arg, "rgb", 3)) {
      /* Force an RGB JPEG file to be generated. */
      jpeg_set_colorspace(cinfo, JCS_RGB);

    } else if (keymatch(arg, "icc", 1)) {
      /* Set ICC filename. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      icc_filename = argv[argn];

    } else if (keymatch(arg, "maxmemory", 3)) {
      /* Maximum memory in Kb (or Mb with 'm'). */
      long lval;
      char ch = 'x';

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%ld%c", &lval, &ch) < 1)
        usage();
      if (ch == 'm' || ch == 'M')
        lval *= 1000L;
      cinfo->mem->max_memory_to_use = lval * 1000L;

    } else if (keymatch(arg, "optimize", 1) || keymatch(arg, "optimise", 1)) {
      /* Enable entropy parm optimization. */
#ifdef ENTROPY_OPT_SUPPORTED
      cinfo->optimize_coding = TRUE;
#else
      fprintf(stderr, "%s: sorry, entropy optimization was not compiled in\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "outfile", 4)) {
      /* Set output file name. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      outfilename = argv[argn]; /* save it away for later use */

    } else if (keymatch(arg, "progressive", 1)) {
      /* Select simple progressive mode. */
#ifdef C_PROGRESSIVE_SUPPORTED
      simple_progressive = TRUE;
      /* We must postpone execution until num_components is known. */
#else
      fprintf(stderr, "%s: sorry, progressive output was not compiled in\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "memdst", 2)) {
      /* Use in-memory destination manager */
#if JPEG_LIB_VERSION >= 80 || defined(MEM_SRCDST_SUPPORTED)
      memdst = TRUE;
#else
      fprintf(stderr, "%s: sorry, in-memory destination manager was not compiled in\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "quality", 1)) {
      /* Quality ratings (quantization table scaling factors). */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      qualityarg = argv[argn];

    } else if (keymatch(arg, "qslots", 2)) {
      /* Quantization table slot numbers. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      qslotsarg = argv[argn];
      /* Must delay setting qslots until after we have processed any
       * colorspace-determining switches, since jpeg_set_colorspace sets
       * default quant table numbers.
       */

    } else if (keymatch(arg, "qtables", 2)) {
      /* Quantization tables fetched from file. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      qtablefile = argv[argn];
      /* We postpone actually reading the file in case -quality comes later. */

    } else if (keymatch(arg, "report", 3)) {
      report = TRUE;

    } else if (keymatch(arg, "restart", 1)) {
      /* Restart interval in MCU rows (or in MCUs with 'b'). */
      long lval;
      char ch = 'x';

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%ld%c", &lval, &ch) < 1)
        usage();
      if (lval < 0 || lval > 65535L)
        usage();
      if (ch == 'b' || ch == 'B') {
        cinfo->restart_interval = (unsigned int)lval;
        cinfo->restart_in_rows = 0; /* else prior '-restart n' overrides me */
      } else {
        cinfo->restart_in_rows = (int)lval;
        /* restart_interval will be computed during startup */
      }

    } else if (keymatch(arg, "sample", 2)) {
      /* Set sampling factors. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      samplearg = argv[argn];
      /* Must delay setting sample factors until after we have processed any
       * colorspace-determining switches, since jpeg_set_colorspace sets
       * default sampling factors.
       */

    } else if (keymatch(arg, "scans", 4)) {
      /* Set scan script. */
#ifdef C_MULTISCAN_FILES_SUPPORTED
      if (++argn >= argc)       /* advance to next argument */
        usage();
      scansarg = argv[argn];
      /* We must postpone reading the file in case -progressive appears. */
#else
      fprintf(stderr, "%s: sorry, multi-scan output was not compiled in\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "smooth", 2)) {
      /* Set input smoothing factor. */
      int val;

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%d", &val) != 1)
        usage();
      if (val < 0 || val > 100)
        usage();
      cinfo->smoothing_factor = val;

    } else if (keymatch(arg, "targa", 1)) {
      /* Input file is Targa format. */
      is_targa = TRUE;

    } else {
      usage();                  /* bogus switch */
    }
  }

  /* Post-switch-scanning cleanup */

  if (for_real) {

    /* Set quantization tables for selected quality. */
    /* Some or all may be overridden if -qtables is present. */
    if (qualityarg != NULL)     /* process -quality if it was present */
      if (!set_quality_ratings(cinfo, qualityarg, force_baseline))
        usage();

    if (qtablefile != NULL)     /* process -qtables if it was present */
      if (!read_quant_tables(cinfo, qtablefile, force_baseline))
        usage();

    if (qslotsarg != NULL)      /* process -qslots if it was present */
      if (!set_quant_slots(cinfo, qslotsarg))
        usage();

    if (samplearg != NULL)      /* process -sample if it was present */
      if (!set_sample_factors(cinfo, samplearg))
        usage();

#ifdef C_PROGRESSIVE_SUPPORTED
    if (simple_progressive)     /* process -progressive; -scans can override */
      jpeg_simple_progression(cinfo);
#endif

#ifdef C_MULTISCAN_FILES_SUPPORTED
    if (scansarg != NULL)       /* process -scans if it was present */
      if (!read_scan_script(cinfo, scansarg))
        usage();
#endif
  }

  return argn;                  /* return index of next arg (file name) */
}